

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

err_t MetaGet(node *p,dataid Id,void *Data,size_t Size)

{
  long *plVar1;
  uint uVar2;
  err_t eVar3;
  size_t sVar4;
  ulong Flags;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  nodedata *pnVar9;
  
  plVar1 = *(long **)((long)p->VMT + -0x28);
  if (plVar1 == (long *)0x0) {
    return -4;
  }
  lVar6 = *plVar1;
  if (lVar6 < 0) {
    return -4;
  }
  lVar7 = 0;
  do {
    uVar5 = (ulong)(lVar7 + lVar6) >> 1;
    if (Id < (ulong)plVar1[uVar5 * 2 + 1]) {
      lVar6 = uVar5 - 1;
    }
    else {
      if (Id <= (ulong)plVar1[uVar5 * 2 + 1]) {
        puVar8 = (uint *)plVar1[uVar5 * 2 + 2];
        uVar2 = *puVar8;
        if ((char)uVar2 == '&') {
          uVar5 = uVar5 - 1;
          puVar8 = (uint *)plVar1[uVar5 * 2 + 2];
          uVar2 = *puVar8;
        }
        else if ((uVar2 & 0xff) == 0x28) {
          eVar3 = (**(code **)(puVar8 + 2))(p,Id,Data,Size);
          return eVar3;
        }
        if ((uVar2 & 0xc0) == 0x40) {
          Flags = (ulong)(uVar2 & 0x3f);
          if (*(long *)(puVar8 + 2) < 0) {
            pnVar9 = (nodedata *)&p->Data;
            do {
              pnVar9 = pnVar9->Next;
              if (pnVar9 == (nodedata *)0x0) {
                if (((char)puVar8[4] == '\x02') && ((puVar8[6] & 0x10) != 0)) {
                  return -3;
                }
                memset(Data,0,Size);
                return 0;
              }
            } while (pnVar9->Code != (Id << 8 | Flags));
            pnVar9 = pnVar9 + 1;
          }
          else {
            pnVar9 = (nodedata *)((long)&p->FourCC + *(long *)(puVar8 + 2));
          }
          if (Flags == 0x18) {
            if ((plVar1[uVar5 * 2 + 3] != Id) || (*(char *)plVar1[uVar5 * 2 + 4] != '&')) {
              __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x834,"err_t MetaGet(node *, dataid, void *, size_t)");
            }
            if (Size != 8) {
              return -3;
            }
            *(ulong *)Data =
                 (ulong)((*(uint *)((char *)plVar1[uVar5 * 2 + 4] + 8) & *(uint *)&pnVar9->Next) !=
                        0);
          }
          else if ((uVar2 & 0x3f) == 4) {
            tcscpy_s((tchar_t *)Data,Size,(tchar_t *)pnVar9);
          }
          else {
            sVar4 = Node_MaxDataSize(p,(ulong)(uVar2 >> 8),Flags,0x28);
            if (sVar4 != Size) {
              __assert_fail("Size == DataSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x83d,"err_t MetaGet(node *, dataid, void *, size_t)");
            }
            if (Size == 4) {
              *(undefined4 *)Data = *(undefined4 *)&pnVar9->Next;
            }
            else {
              memcpy(Data,pnVar9,Size);
            }
          }
          return 0;
        }
        __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x818,"err_t MetaGet(node *, dataid, void *, size_t)");
      }
      lVar7 = uVar5 + 1;
    }
    if (lVar6 < lVar7) {
      return -4;
    }
  } while( true );
}

Assistant:

static err_t MetaGet(node* p,dataid Id,void* Data,size_t Size)
{
    const nodeclass* Class = NodeGetClass(p);
    nodemetalookuphead* Head = Class->MetaGet;
    if (Head)
    {
        nodemetalookup* Lookup = (nodemetalookup*)(Head+1);
        intptr_t Mid;
        intptr_t Lower = 0;
        intptr_t Upper = Head->Upper;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            if (Lookup[Mid].Id>Id)
                Upper = Mid-1;
            else if (Lookup[Mid].Id<Id)
                Lower = Mid+1;
            else
            {
                const nodemeta* m = Lookup[Mid].Meta;
                const void* Ptr;
                datatype Type;

                if (m->Meta == META_PARAM_GET)
                    return ((err_t(*)(node*,dataid,void*,size_t))m->Data)(p,Id,Data,Size);

                if (m->Meta == META_PARAM_BIT)
                    m = Lookup[--Mid].Meta;

                assert((m->Meta & META_MODE_MASK)==META_MODE_DATA);

                Type = (m->Meta & TYPE_MASK);
                if ((intptr_t)m->Data<0)
                {
                    Ptr = Node_GetData(p,Id,Type);
                    if (!Ptr)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS && (m[2].Data & DFLAG_NODEFAULT))
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS && (m[1].Data & DFLAG_NODEFAULT))
#endif
                            return ERR_INVALID_DATA;

                        memset(Data,0,Size);
                        return ERR_NONE;
                    }
                }
                else
                    Ptr = (const uint8_t*)p + (intptr_t)m->Data;

                if (Type == TYPE_STRING)
                    tcscpy_s(Data,Size/sizeof(tchar_t),(const tchar_t*)Ptr);
                else
                if (Type == TYPE_BOOL_BIT)
                {
                    uint32_t Bit;
                    assert(Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT);
                    Bit = (uint32_t)Lookup[Mid+1].Meta->Data;
                    if (Size != sizeof(bool_t))
                        return ERR_INVALID_DATA;
                    *(bool_t*)Data = (*(const uint32_t*)Ptr & Bit) != 0;
                }
                else
                {
                    size_t DataSize = Node_MaxDataSize(p,m->Id,Type,META_PARAM_GET);
                    assert(Size == DataSize);
                    if (DataSize != Size)
                        return ERR_INVALID_DATA;

                    if (DataSize==sizeof(int))
                        *(int*)Data = *(const int*)Ptr;
                    else
                        memcpy(Data,Ptr,DataSize);
                }

                return ERR_NONE;
            }
        }
    }
    return ERR_INVALID_PARAM;
}